

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::Image::applyMask(Image *this,Image *mask)

{
  int local_40;
  int local_3c;
  int32 x;
  int32 y;
  uint8 *m;
  uint8 *p;
  uint8 *mline;
  uint8 *line;
  Image *mask_local;
  Image *this_local;
  
  if ((((this->width == mask->width) && (this->height == mask->height)) && (mask->depth != 0x10)) &&
     (mask->depth != 0x18)) {
    convertTo32(this);
    mline = this->pixels;
    p = mask->pixels;
    for (local_3c = 0; local_3c < this->height; local_3c = local_3c + 1) {
      m = mline;
      _x = p;
      for (local_40 = 0; local_40 < this->width; local_40 = local_40 + 1) {
        if (mask->depth == 0x20) {
          m[3] = _x[3];
        }
        else if (mask->depth < 9) {
          m[3] = mask->palette[(int)((uint)*_x * 4 + 3)];
        }
        m = m + this->bpp;
        _x = _x + mask->bpp;
      }
      mline = mline + this->stride;
      p = p + mask->stride;
    }
  }
  return;
}

Assistant:

void
Image::applyMask(Image *mask)
{
	if(this->width != mask->width || this->height != mask->height)
		return;	// TODO: set an error
	// we could use alpha with 16 bits but what's the point?
	if(mask->depth == 16 || mask->depth == 24)
		return;

	this->convertTo32();
	assert(this->depth == 32);

	uint8 *line = this->pixels;
	uint8 *mline = mask->pixels;
	uint8 *p, *m;
	for(int32 y = 0; y < this->height; y++){
		p = line;
		m = mline;
		for(int32 x = 0; x < this->width; x++){
			if(mask->depth == 32)
				p[3] = m[3];
			else if(mask->depth <= 8)
				p[3] = mask->palette[m[0]*4+3];
			p += this->bpp;
			m += mask->bpp;
		}
		line += this->stride;
		mline += mask->stride;
	}
}